

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

char * luaT_objtypename(lua_State *L,TValue *o)

{
  TString *key;
  TValue *pTVar1;
  TValue *name;
  Table *mt;
  TValue *o_local;
  lua_State *L_local;
  
  if (((o->tt_ == 0x45) && (name = *(TValue **)((o->value_).f + 0x28), name != (TValue *)0x0)) ||
     ((o->tt_ == 0x47 && (name = *(TValue **)((o->value_).f + 0x10), name != (TValue *)0x0)))) {
    key = luaS_new(L,"__name");
    pTVar1 = luaH_getshortstr((Table *)name,key);
    if ((pTVar1->tt_ & 0xfU) == 4) {
      return (char *)((pTVar1->value_).f + 0x18);
    }
  }
  return luaT_typenames_[(int)((o->tt_ & 0xfU) + 1)];
}

Assistant:

const char *luaT_objtypename (lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttistable(o) && (mt = hvalue(o)->metatable) != NULL) ||
      (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  return ttypename(ttnov(o));  /* else use standard type name */
}